

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void draw_sprite(Sprite *spr)

{
  float fVar1;
  float fVar2;
  ALLEGRO_BITMAP *pAVar3;
  int iVar4;
  int iVar5;
  uint *in_RDI;
  undefined4 uVar6;
  ulong uVar7;
  float cy;
  float cx;
  ALLEGRO_COLOR tint;
  ALLEGRO_BITMAP *bmp;
  
  pAVar3 = images[*in_RDI];
  fVar1 = (float)in_RDI[3];
  iVar4 = al_get_bitmap_width(pAVar3);
  fVar2 = (float)in_RDI[6];
  iVar5 = al_get_bitmap_height(pAVar3);
  uVar7 = (ulong)in_RDI[9];
  uVar6 = al_map_rgba_f(in_RDI[8],uVar7,in_RDI[10],in_RDI[0xb]);
  al_draw_tinted_scaled_rotated_bitmap
            (uVar6,uVar7,fVar1 * (float)iVar4,fVar2 * (float)iVar5,in_RDI[1],in_RDI[4],in_RDI[2],
             in_RDI[5],pAVar3,0);
  return;
}

Assistant:

static void draw_sprite(const Sprite *spr)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_COLOR tint;
   float cx, cy;

   bmp = images[spr->image];
   cx = spr->align_x * al_get_bitmap_width(bmp);
   cy = spr->align_y * al_get_bitmap_height(bmp);
   tint = al_map_rgba_f(spr->r, spr->g, spr->b, spr->opacity);

   al_draw_tinted_scaled_rotated_bitmap(bmp, tint, cx, cy,
      spr->x, spr->y, spr->scale_x, spr->scale_y, spr->angle, 0);
}